

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O3

SUNErrCode SUNProfiler_GetTimerResolution(SUNProfiler p,double *resolution)

{
  sunTimespec spec;
  timespec local_20;
  
  if (p != (SUNProfiler)0x0) {
    clock_getres(1,&local_20);
    *resolution = (double)local_20.tv_nsec * 1e-09;
    return 0;
  }
  return -9999;
}

Assistant:

SUNErrCode SUNProfiler_GetTimerResolution(SUNProfiler p, double* resolution)
{
  if (!p) { return SUN_ERR_ARG_CORRUPT; }

#if defined(SUNDIALS_HAVE_POSIX_TIMERS)
  sunTimespec spec;
  clock_getres(CLOCK_MONOTONIC, &spec);
  *resolution = 1e-9 * ((double)spec.tv_nsec);

  return SUN_SUCCESS;
#elif (defined(WIN32) || defined(_WIN32))
  static LARGE_INTEGER ticks_per_sec;

  if (!ticks_per_sec.QuadPart)
  {
    QueryPerformanceFrequency(&ticks_per_sec);
    if (!ticks_per_sec.QuadPart) { return -1; }
  }

  *resolution = (double)ticks_per_sec.QuadPart;

  return SUN_SUCCESS;
#else
#error SUNProfiler needs POSIX or Windows timers
#endif
}